

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stoch.c
# Opt level: O2

ErrorNumber test_func_stoch(TA_History *history)

{
  int iVar1;
  TA_MAType optInMAType;
  TA_Real *pTVar2;
  TA_Real *pTVar3;
  TA_Real *pTVar4;
  TA_RetCode TVar5;
  TA_RetCode retCode;
  ErrorNumber EVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  TestId TVar11;
  undefined4 extraout_var;
  double *inReal;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  TA_Test_conflict15 *pTVar23;
  TA_Real TVar24;
  TA_Real TVar25;
  double dVar26;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  ulong local_b0;
  int local_a4;
  ulong local_a0;
  int local_98;
  int local_94;
  TA_MAType local_90;
  int local_8c;
  TA_MAType local_88;
  int local_84;
  ulong local_80;
  TA_Real *local_78;
  TA_Real *local_70;
  TA_History *local_68;
  undefined8 local_60;
  TA_Real *local_58;
  TA_Test_conflict15 *local_50;
  TA_Real *local_48;
  TA_Real *pTStack_40;
  TA_Real *local_38;
  
  uVar22 = 0;
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  while( true ) {
    if (uVar22 == 0xb) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    if ((int)history->nbBars < tableTest[uVar22].expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_stoch.c"
             ,uVar22 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    pTVar23 = tableTest + uVar22;
    local_b0 = uVar22;
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    retCode = TA_NOT_SUPPORTED;
    if (tableTest[uVar22].optInMAType_1 == 1) {
      TVar5 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,tableTest[uVar22].unstablePeriod);
      retCode = TA_SUCCESS;
      if (TVar5 != TA_SUCCESS) {
        uVar22 = 0x8a;
        uVar13 = local_b0;
        goto LAB_0011bada;
      }
    }
    TVar11 = pTVar23->testId;
    if (TVar11 == TEST_STOCHRSI) {
      retCode = TA_STOCHRSI(tableTest[uVar22].startIdx,tableTest[uVar22].endIdx,gBuffer[2].in,
                            tableTest[uVar22].optInPeriod_0,tableTest[uVar22].optInPeriod_1,
                            tableTest[uVar22].optInPeriod_2,tableTest[uVar22].optInMAType_2,
                            &outBegIdx,&outNbElement,gBuffer[0].out0,gBuffer[0].out1);
    }
    else if (TVar11 == TEST_STOCHF) {
      retCode = TA_STOCHF(tableTest[uVar22].startIdx,tableTest[uVar22].endIdx,gBuffer[0].in,
                          gBuffer[1].in,gBuffer[2].in,tableTest[uVar22].optInPeriod_0,
                          tableTest[uVar22].optInPeriod_1,tableTest[uVar22].optInMAType_1,&outBegIdx
                          ,&outNbElement,gBuffer[0].out0,gBuffer[0].out1);
    }
    else if (TVar11 == TEST_STOCH) {
      retCode = TA_STOCH(tableTest[uVar22].startIdx,tableTest[uVar22].endIdx,gBuffer[0].in,
                         gBuffer[1].in,gBuffer[2].in,tableTest[uVar22].optInPeriod_0,
                         tableTest[uVar22].optInPeriod_1,tableTest[uVar22].optInMAType_1,
                         tableTest[uVar22].optInPeriod_2,tableTest[uVar22].optInMAType_2,&outBegIdx,
                         &outNbElement,gBuffer[0].out0,gBuffer[0].out1);
    }
    EVar6 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar6 != TA_TEST_PASS) ||
        (EVar6 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar6 != TA_TEST_PASS))
       || (EVar6 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
          EVar6 != TA_TEST_PASS)) goto LAB_0011ba7f;
    EVar6 = checkExpectedValue(gBuffer[0].out0,retCode,tableTest[uVar22].expectedRetCode,outBegIdx,
                               tableTest[uVar22].expectedBegIdx,outNbElement,
                               tableTest[uVar22].expectedNbElement,
                               tableTest[uVar22].oneOfTheExpectedOutReal0,
                               tableTest[uVar22].oneOfTheExpectedOutRealIndex0);
    uVar16 = 0;
    if (EVar6 != TA_TEST_PASS) break;
    EVar6 = checkExpectedValue(gBuffer[0].out1,retCode,tableTest[uVar22].expectedRetCode,outBegIdx,
                               tableTest[uVar22].expectedBegIdx,outNbElement,
                               tableTest[uVar22].expectedNbElement,
                               tableTest[uVar22].oneOfTheExpectedOutReal1,
                               tableTest[uVar22].oneOfTheExpectedOutRealIndex1);
    pTVar3 = gBuffer[1].in;
    pTVar2 = gBuffer[0].in;
    if (EVar6 != TA_TEST_PASS) {
LAB_0011ba88:
      uVar16 = 1;
      break;
    }
    outNbElement = 0;
    outBegIdx = 0;
    TVar11 = pTVar23->testId;
    if (TVar11 == TEST_STOCH) {
      iVar1 = tableTest[uVar22].endIdx;
      local_58 = gBuffer[2].in;
      local_a4 = tableTest[uVar22].startIdx;
      local_a0 = (ulong)(uint)tableTest[uVar22].optInPeriod_0;
      local_84 = tableTest[uVar22].optInPeriod_1;
      local_88 = tableTest[uVar22].optInMAType_1;
      iVar9 = tableTest[uVar22].optInPeriod_2;
      optInMAType = tableTest[uVar22].optInMAType_2;
      local_70 = gBuffer[1].out0;
      local_78 = gBuffer[1].out1;
      local_68 = history;
      iVar7 = TA_MA_Lookback(local_84,local_88);
      iVar10 = local_a4;
      local_60 = CONCAT44(extraout_var,iVar7);
      uVar17 = (ulong)optInMAType;
      local_90 = optInMAType;
      local_8c = iVar9;
      uVar8 = TA_MA_Lookback(iVar9,optInMAType);
      pTVar4 = local_58;
      history = local_68;
      iVar20 = (int)local_60;
      iVar7 = (int)local_a0;
      uVar13 = (ulong)uVar8;
      iVar9 = uVar8 + iVar20 + iVar7 + -1;
      if (iVar10 < iVar9) {
        iVar10 = iVar9;
      }
      if (iVar1 < iVar10) {
        outBegIdx = 0;
        outNbElement = 0;
        retCode = TA_SUCCESS;
      }
      else {
        iVar9 = iVar10 - iVar9;
        iVar21 = iVar7 + -1 + iVar9;
        uVar15 = (undefined4)CONCAT71((int7)(uVar17 >> 8),1);
        inReal = local_70;
        local_a4 = iVar10;
        local_80 = uVar13;
        if ((((local_70 != local_58) && (inReal = local_70, local_70 != pTVar2)) &&
            ((inReal = local_70, local_70 != pTVar3 &&
             ((inReal = local_78, local_78 != local_58 && (local_78 != pTVar2)))))) &&
           (local_78 != pTVar3)) {
          local_98 = iVar9;
          local_94 = iVar21;
          inReal = (double *)malloc((long)((iVar1 - iVar21) + 1) << 3);
          iVar20 = (int)local_60;
          iVar7 = (int)local_a0;
          uVar8 = (uint)local_80;
          uVar15 = 0;
          iVar9 = local_98;
          iVar21 = local_94;
        }
        local_a0 = CONCAT44(local_a0._4_4_,uVar15);
        iVar10 = (local_a4 - (iVar7 + iVar20 + uVar8)) + 2;
        lVar12 = (long)iVar9;
        lVar18 = 0;
        for (lVar14 = (long)iVar21; lVar14 <= iVar1; lVar14 = lVar14 + 1) {
          TVar25 = pTVar3[lVar12];
          TVar24 = pTVar2[lVar12];
          for (lVar19 = (long)iVar10; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
            dVar26 = pTVar3[lVar19];
            if (TVar25 <= pTVar3[lVar19]) {
              dVar26 = TVar25;
            }
            TVar25 = dVar26;
            dVar26 = pTVar2[lVar19];
            if (pTVar2[lVar19] <= TVar24) {
              dVar26 = TVar24;
            }
            TVar24 = dVar26;
          }
          dVar26 = 100.0;
          if (0.0 < TVar24 - TVar25) {
            dVar26 = ((pTVar4[lVar14] - TVar25) / (TVar24 - TVar25)) * 100.0;
          }
          lVar12 = lVar12 + 1;
          inReal[lVar18] = dVar26;
          lVar18 = lVar18 + 1;
          iVar10 = iVar10 + 1;
        }
        retCode = TA_MA(0,(int)lVar18 + -1,inReal,local_84,local_88,&outBegIdx,&outNbElement,inReal)
        ;
        if ((retCode == TA_SUCCESS) && (outNbElement != 0)) {
          retCode = TA_MA(0,outNbElement + -1,inReal,local_8c,local_90,&outBegIdx,&outNbElement,
                          local_78);
          memmove(local_70,inReal + (int)local_80,(long)outNbElement << 3);
          if ((char)local_a0 == '\0') {
            free(inReal);
          }
          if (retCode == TA_SUCCESS) {
            outBegIdx = local_a4;
            retCode = TA_SUCCESS;
            goto LAB_0011b79f;
          }
        }
        else if ((char)local_a0 == '\0') {
          free(inReal);
        }
        outBegIdx = 0;
        outNbElement = 0;
      }
LAB_0011b79f:
      EVar6 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
      if (((EVar6 == TA_TEST_PASS) &&
          (EVar6 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar6 == TA_TEST_PASS)
          ) && (EVar6 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
               EVar6 == TA_TEST_PASS)) {
        EVar6 = checkExpectedValue(gBuffer[1].out0,retCode,tableTest[uVar22].expectedRetCode,
                                   outBegIdx,tableTest[uVar22].expectedBegIdx,outNbElement,
                                   tableTest[uVar22].expectedNbElement,
                                   tableTest[uVar22].oneOfTheExpectedOutReal0,
                                   tableTest[uVar22].oneOfTheExpectedOutRealIndex0);
        if (EVar6 != TA_TEST_PASS) goto LAB_0011baba;
        EVar6 = checkExpectedValue(gBuffer[1].out1,retCode,tableTest[uVar22].expectedRetCode,
                                   outBegIdx,tableTest[uVar22].expectedBegIdx,outNbElement,
                                   tableTest[uVar22].expectedNbElement,
                                   tableTest[uVar22].oneOfTheExpectedOutReal1,
                                   tableTest[uVar22].oneOfTheExpectedOutRealIndex1);
        if (EVar6 != TA_TEST_PASS) goto LAB_0011ba88;
        EVar6 = checkSameContent(gBuffer[1].out0,gBuffer[0].out0);
        if ((EVar6 == TA_TEST_PASS) &&
           (EVar6 = checkSameContent(gBuffer[1].out1,gBuffer[0].out1), EVar6 == TA_TEST_PASS)) {
          TVar11 = pTVar23->testId;
          goto LAB_0011b889;
        }
      }
LAB_0011ba7f:
      uVar22 = (ulong)EVar6;
      uVar13 = local_b0;
      goto LAB_0011bada;
    }
LAB_0011b889:
    if (TVar11 == TEST_STOCHRSI) {
      retCode = TA_STOCHRSI(tableTest[uVar22].startIdx,tableTest[uVar22].endIdx,gBuffer[2].in,
                            tableTest[uVar22].optInPeriod_0,tableTest[uVar22].optInPeriod_1,
                            tableTest[uVar22].optInPeriod_2,tableTest[uVar22].optInMAType_2,
                            &outBegIdx,&outNbElement,gBuffer[0].in,gBuffer[1].in);
    }
    else if (TVar11 == TEST_STOCHF) {
      retCode = TA_STOCHF(tableTest[uVar22].startIdx,tableTest[uVar22].endIdx,gBuffer[0].in,
                          gBuffer[1].in,gBuffer[2].in,tableTest[uVar22].optInPeriod_0,
                          tableTest[uVar22].optInPeriod_1,tableTest[uVar22].optInMAType_1,&outBegIdx
                          ,&outNbElement,gBuffer[0].in,gBuffer[1].in);
    }
    else if (TVar11 == TEST_STOCH) {
      retCode = TA_STOCH(tableTest[uVar22].startIdx,tableTest[uVar22].endIdx,gBuffer[0].in,
                         gBuffer[1].in,gBuffer[2].in,tableTest[uVar22].optInPeriod_0,
                         tableTest[uVar22].optInPeriod_1,tableTest[uVar22].optInMAType_1,
                         tableTest[uVar22].optInPeriod_2,tableTest[uVar22].optInMAType_2,&outBegIdx,
                         &outNbElement,gBuffer[0].in,gBuffer[1].in);
    }
    EVar6 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
    if ((EVar6 != TA_TEST_PASS) ||
       (EVar6 = checkSameContent(gBuffer[0].out1,gBuffer[1].in), EVar6 != TA_TEST_PASS))
    goto LAB_0011ba7f;
    EVar6 = checkExpectedValue(gBuffer[0].in,retCode,tableTest[uVar22].expectedRetCode,outBegIdx,
                               tableTest[uVar22].expectedBegIdx,outNbElement,
                               tableTest[uVar22].expectedNbElement,
                               tableTest[uVar22].oneOfTheExpectedOutReal0,
                               tableTest[uVar22].oneOfTheExpectedOutRealIndex0);
    if (EVar6 != TA_TEST_PASS) {
LAB_0011baba:
      uVar16 = 0;
      break;
    }
    EVar6 = checkExpectedValue(gBuffer[1].in,retCode,tableTest[uVar22].expectedRetCode,outBegIdx,
                               tableTest[uVar22].expectedBegIdx,outNbElement,
                               tableTest[uVar22].expectedNbElement,
                               tableTest[uVar22].oneOfTheExpectedOutReal1,
                               tableTest[uVar22].oneOfTheExpectedOutRealIndex1);
    uVar13 = local_b0;
    if (EVar6 != TA_TEST_PASS) goto LAB_0011ba88;
    local_48 = history->high;
    pTStack_40 = history->low;
    local_38 = history->close;
    local_50 = pTVar23;
    if (((tableTest[uVar22].doRangeTestFlag != 0) && ((ulong)pTVar23->testId < 3)) &&
       (EVar6 = doRangeTest(rangeTestFunction,
                            *(TA_FuncUnstId *)(&DAT_0018189c + (ulong)pTVar23->testId * 4),&local_50
                            ,2,0), EVar6 != TA_TEST_PASS)) {
      uVar22 = (ulong)EVar6;
      goto LAB_0011bada;
    }
    uVar22 = uVar13 + 1;
  }
  uVar13 = local_b0;
  uVar22 = (ulong)EVar6;
  printf("Fail for output id=%d\n",uVar16);
LAB_0011bada:
  printf("%s Failed Test #%d (Code=%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_stoch.c"
         ,uVar13 & 0xffffffff,uVar22);
  return (ErrorNumber)uVar22;
}

Assistant:

ErrorNumber test_func_stoch( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}